

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void prepare_pragma_string(char *repr,VARR_char *to)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  
  sVar1 = strlen(repr);
  VARR_chartrunc(to,0);
  iVar3 = (int)sVar1;
  if ((iVar3 != 0) && (*repr != '\"' || iVar3 != 1)) {
    iVar3 = iVar3 - (uint)(repr[iVar3 + -1] == '\"');
    for (uVar2 = (ulong)(*repr == '\"'); (long)uVar2 < (long)iVar3; uVar2 = uVar2 + 1) {
      if (((repr[uVar2] != '\\') || (iVar3 <= (int)uVar2 + 1)) ||
         ((repr[uVar2 + 1] != '\"' && (repr[uVar2 + 1] != '\\')))) {
        VARR_charpush(to,repr[uVar2]);
      }
    }
  }
  reverse(to);
  return;
}

Assistant:

static void prepare_pragma_string (const char *repr, VARR (char) * to) {
  destringify (repr, to);
  reverse (to);
}